

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

void __thiscall
pbrt::PathIntegrator::PathIntegrator
          (PathIntegrator *this,int maxDepth,CameraHandle *camera,SamplerHandle *sampler,
          PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights,Float rrThreshold,
          string *lightSampleStrategy,bool regularize)

{
  span<const_pbrt::LightHandle> lights_00;
  string *in_RCX;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *in_RDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  Allocator in_R8;
  LightHandle *in_R9;
  undefined4 in_XMM0_Da;
  polymorphic_allocator<std::byte> *in_stack_00000008;
  byte in_stack_00000010;
  SamplerHandle *in_stack_ffffffffffffff18;
  SamplerHandle *in_stack_ffffffffffffff20;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *in_stack_ffffffffffffff70;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *in_stack_ffffffffffffff90;
  pointer in_stack_ffffffffffffff98;
  SamplerHandle *in_stack_ffffffffffffffa0;
  CameraHandle *in_stack_ffffffffffffffa8;
  RayIntegrator *in_stack_ffffffffffffffb0;
  
  CameraHandle::CameraHandle
            ((CameraHandle *)in_stack_ffffffffffffff20,(CameraHandle *)in_stack_ffffffffffffff18);
  SamplerHandle::SamplerHandle(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  PrimitiveHandle::PrimitiveHandle
            ((PrimitiveHandle *)in_stack_ffffffffffffff20,
             (PrimitiveHandle *)in_stack_ffffffffffffff18);
  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
            (in_stack_ffffffffffffff70,
             (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
             &stack0xffffffffffffff98);
  RayIntegrator::RayIntegrator
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             (PrimitiveHandle *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::~vector
            ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)in_RCX);
  *in_RDI = &PTR__PathIntegrator_0350e438;
  *(undefined4 *)(in_RDI + 0xd) = in_ESI;
  *(undefined4 *)((long)in_RDI + 0x6c) = in_XMM0_Da;
  pstd::span<pbrt::LightHandle_const>::
  span<std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>,void,std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>>
            ((span<const_pbrt::LightHandle> *)in_RCX,in_RDX);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator(in_stack_00000008);
  lights_00.n = (size_t)in_RDI;
  lights_00.ptr = in_R9;
  LightSamplerHandle::Create(in_RCX,lights_00,in_R8);
  *(byte *)(in_RDI + 0xf) = in_stack_00000010 & 1;
  return;
}

Assistant:

PathIntegrator::PathIntegrator(int maxDepth, CameraHandle camera, SamplerHandle sampler,
                               PrimitiveHandle aggregate, std::vector<LightHandle> lights,
                               Float rrThreshold, const std::string &lightSampleStrategy,
                               bool regularize)
    : RayIntegrator(camera, sampler, aggregate, lights),
      maxDepth(maxDepth),
      rrThreshold(rrThreshold),
      lightSampler(LightSamplerHandle::Create(lightSampleStrategy, lights, Allocator())),
      regularize(regularize) {}